

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

bool __thiscall
QGraphicsViewPrivate::canStartScrollingAt(QGraphicsViewPrivate *this,QPoint *startPos)

{
  QGraphicsView *this_00;
  bool bVar1;
  GraphicsItemFlags GVar2;
  QGraphicsItem *this_01;
  
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if (*(int *)(*(long *)(this_00 + 8) + 0x2fc) != 0) {
    return false;
  }
  this_01 = QGraphicsView::itemAt(this_00,startPos);
  if (((this_01 != (QGraphicsItem *)0x0) && ((startPos->yp).m_i != 0 || (startPos->xp).m_i != 0)) &&
     (GVar2 = QGraphicsItem::flags(this_01),
     ((uint)GVar2.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
            super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 1) != 0)) {
    return false;
  }
  bVar1 = QAbstractScrollAreaPrivate::canStartScrollingAt
                    (&this->super_QAbstractScrollAreaPrivate,startPos);
  return bVar1;
}

Assistant:

bool QGraphicsViewPrivate::canStartScrollingAt(const QPoint &startPos) const
{
    Q_Q(const QGraphicsView);
    if (q->dragMode() != QGraphicsView::NoDrag)
        return false;

    const QGraphicsItem *childItem = q->itemAt(startPos);

    if (!startPos.isNull() && childItem && (childItem->flags() & QGraphicsItem::ItemIsMovable))
        return false;

    return QAbstractScrollAreaPrivate::canStartScrollingAt(startPos);
}